

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_sync(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((((ctx->opcode & 0x600000) == 0x400000) || ((ctx->insns_flags & 0x20) == 0)) &&
     (ctx->pr == false)) {
    gen_check_tlb_flush(ctx,true);
  }
  tcg_gen_mb_ppc64(tcg_ctx,TCG_BAR_SC|TCG_MO_ALL);
  return;
}

Assistant:

static void gen_sync(TCGContext *tcg_ctx, int stype)
{
    TCGBar tcg_mo = TCG_BAR_SC;

    switch (stype) {
    case 0x4: /* SYNC_WMB */
        tcg_mo |= TCG_MO_ST_ST;
        break;
    case 0x10: /* SYNC_MB */
        tcg_mo |= TCG_MO_ALL;
        break;
    case 0x11: /* SYNC_ACQUIRE */
        tcg_mo |= TCG_MO_LD_LD | TCG_MO_LD_ST;
        break;
    case 0x12: /* SYNC_RELEASE */
        tcg_mo |= TCG_MO_ST_ST | TCG_MO_LD_ST;
        break;
    case 0x13: /* SYNC_RMB */
        tcg_mo |= TCG_MO_LD_LD;
        break;
    default:
        tcg_mo |= TCG_MO_ALL;
        break;
    }

    tcg_gen_mb(tcg_ctx, tcg_mo);
}